

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay,ImU32 bg_col)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImU32 col;
  char cVar5;
  ImGuiCol idx;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool held;
  bool hovered;
  ImRect bb_render;
  ImRect bb_interact;
  bool local_8a;
  bool local_89;
  ImVec2 local_88;
  ImVec2 aIStack_80 [2];
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  ImU32 local_5c;
  float *local_58;
  float *local_50;
  ImRect local_48;
  ImGuiWindow *local_38;
  
  pIVar2 = GImGui;
  local_38 = GImGui->CurrentWindow;
  uVar6 = GImGui->CurrentItemFlags;
  GImGui->CurrentItemFlags = uVar6 | 0x18;
  local_6c = hover_visibility_delay;
  local_68 = min_size2;
  local_64 = min_size1;
  local_60 = hover_extend;
  local_5c = bg_col;
  local_58 = size1;
  local_50 = size2;
  bVar4 = ItemAdd(bb,id,(ImRect *)0x0,0);
  pIVar2->CurrentItemFlags = uVar6;
  cVar5 = '\0';
  if (bVar4) {
    fVar7 = 0.0;
    fVar9 = local_60;
    if (axis == ImGuiAxis_Y) {
      fVar7 = local_60;
      fVar9 = 0.0;
    }
    local_48.Min.x = (bb->Min).x;
    local_48.Min.y = (bb->Min).y;
    local_48.Min.y = local_48.Min.y - fVar7;
    local_48.Min.x = local_48.Min.x - fVar9;
    local_48.Max.x = (bb->Max).x;
    local_48.Max.y = (bb->Max).y;
    local_48.Max.y = fVar7 + local_48.Max.y;
    local_48.Max.x = fVar9 + local_48.Max.x;
    ButtonBehavior(&local_48,id,&local_89,&local_8a,0x1800);
    if (local_89 == true) {
      pIVar1 = &(pIVar2->LastItemData).StatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 | 1;
    }
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((local_8a != false) ||
       (((local_89 == true && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_6c <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((axis != ImGuiAxis_Y) + 3);
    }
    local_88 = bb->Min;
    aIStack_80[0] = bb->Max;
    if (local_8a == true) {
      if (axis == ImGuiAxis_Y) {
        fVar7 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_48.Min.y;
      }
      else {
        fVar7 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_48.Min.x;
      }
      fVar8 = *local_58 - local_64;
      fVar9 = *local_50 - local_68;
      fVar9 = (float)(~-(uint)(fVar9 <= 0.0) & (uint)fVar9);
      fVar10 = -fVar8;
      uVar6 = -(uint)(fVar8 <= fVar10);
      fVar8 = (float)(~uVar6 & (uint)fVar10 | uVar6 & 0x80000000);
      if (fVar8 <= fVar7) {
        fVar8 = fVar7;
      }
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
      }
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        fVar7 = *local_58 + fVar9;
        if ((fVar9 < 0.0) && (fVar7 < local_64)) {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                        ,0x5d6,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float, ImU32)"
                       );
        }
        fVar8 = 0.0;
        if ((0.0 < fVar9) && (*local_50 - fVar9 < local_68)) {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                        ,0x5d8,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float, ImU32)"
                       );
        }
        *local_58 = fVar7;
        *local_50 = *local_50 - fVar9;
        fVar7 = fVar9;
        if (axis == ImGuiAxis_X) {
          fVar7 = 0.0;
          fVar8 = fVar9;
        }
        local_88.y = local_88.y + fVar7;
        local_88.x = local_88.x + fVar8;
        aIStack_80[0].y = fVar7 + aIStack_80[0].y;
        aIStack_80[0].x = fVar8 + aIStack_80[0].x;
        MarkItemEdited(id);
      }
    }
    pIVar3 = local_38;
    if (0xffffff < local_5c) {
      ImDrawList::AddRectFilled(local_38->DrawList,&local_88,aIStack_80,local_5c,0.0,0);
    }
    idx = 0x1d;
    if ((local_8a == false) && (idx = 0x1b, local_89 == true)) {
      idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_6c);
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(pIVar3->DrawList,&local_88,aIStack_80,col,0.0,0);
    cVar5 = local_8a;
  }
  return (bool)cVar5;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay, ImU32 bg_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = g.CurrentItemFlags;
    g.CurrentItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    g.CurrentItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (hovered)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect; // for IsItemHovered(), because bb_interact is larger than bb
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (hovered && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render at new position
    if (bg_col & IM_COL32_A_MASK)
        window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, bg_col, 0.0f);
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}